

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeObj(SPxLPBase<double> *this,VectorBase<double> *newObj,bool scale)

{
  pointer pdVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x26])
            (this,newObj,CONCAT71(in_register_00000011,scale));
  if (this->thesense == MINIMIZE) {
    pdVar1 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar2 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = -pdVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
  }
  return;
}

Assistant:

virtual void changeObj(const VectorBase<R>& newObj, bool scale = false)
   {
      changeMaxObj(newObj, scale);

      if(spxSense() == MINIMIZE)
         LPColSetBase<R>::maxObj_w() *= -1;
   }